

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::DebugNodeTabBar(ImGuiTabBar *tab_bar,char *label)

{
  ImGuiTabItem *tab;
  float fVar1;
  int iVar2;
  uint uVar3;
  ImGuiTabItem *pIVar4;
  ImGuiWindow *pIVar5;
  ImGuiContext *pIVar6;
  bool bVar7;
  bool bVar8;
  char *pcVar9;
  ImDrawList *this;
  undefined8 uVar10;
  int iVar11;
  ulong uVar12;
  long lVar13;
  char buf [256];
  ImVec2 local_148;
  ImVec2 local_140;
  char local_138 [264];
  
  iVar2 = tab_bar->PrevFrameVisible;
  iVar11 = GImGui->FrameCount + -2;
  pcVar9 = " *Inactive*";
  if (iVar11 <= iVar2) {
    pcVar9 = "";
  }
  ImFormatString(local_138,0x100,"%s 0x%08X (%d tabs)%s",label,(ulong)tab_bar->ID,
                 (ulong)(uint)(tab_bar->Tabs).Size,pcVar9);
  if (iVar2 < iVar11) {
    PushStyleColor(0,(GImGui->Style).Colors + 1);
  }
  bVar7 = TreeNode(label,"%s",local_138);
  if (iVar2 < iVar11) {
    PopStyleColor(1);
  }
  else {
    bVar8 = IsItemHovered(0);
    if (bVar8) {
      this = GetForegroundDrawList();
      ImDrawList::AddRect(this,&(tab_bar->BarRect).Min,&(tab_bar->BarRect).Max,0xff00ffff,0.0,0,1.0)
      ;
      local_140.y = (tab_bar->BarRect).Min.y;
      local_148.x = tab_bar->ScrollingRectMinX;
      local_148.y = (tab_bar->BarRect).Max.y;
      local_140.x = local_148.x;
      ImDrawList::AddLine(this,&local_140,&local_148,0xff00ff00,1.0);
      local_140.y = (tab_bar->BarRect).Min.y;
      local_148.x = tab_bar->ScrollingRectMaxX;
      local_148.y = (tab_bar->BarRect).Max.y;
      local_140.x = local_148.x;
      ImDrawList::AddLine(this,&local_140,&local_148,0xff00ff00,1.0);
    }
  }
  if (bVar7) {
    if (0 < (tab_bar->Tabs).Size) {
      lVar13 = 0;
      uVar12 = 0;
      do {
        pIVar4 = (tab_bar->Tabs).Data;
        tab = (ImGuiTabItem *)((long)&pIVar4->ID + lVar13);
        PushID(tab);
        bVar7 = SmallButton("<");
        if (bVar7) {
          TabBarQueueReorder(tab_bar,tab,-1);
        }
        pIVar5 = GImGui->CurrentWindow;
        pIVar5->WriteAccessed = true;
        if (pIVar5->SkipItems == false) {
          fVar1 = (pIVar5->DC).CursorPosPrevLine.y;
          (pIVar5->DC).CursorPos.x = (pIVar5->DC).CursorPosPrevLine.x + 2.0;
          (pIVar5->DC).CursorPos.y = fVar1;
          (pIVar5->DC).CurrLineSize = (pIVar5->DC).PrevLineSize;
          (pIVar5->DC).CurrLineTextBaseOffset = (pIVar5->DC).PrevLineTextBaseOffset;
        }
        bVar7 = SmallButton(">");
        if (bVar7) {
          TabBarQueueReorder(tab_bar,tab,1);
        }
        pIVar6 = GImGui;
        pIVar5 = GImGui->CurrentWindow;
        pIVar5->WriteAccessed = true;
        if (pIVar5->SkipItems == false) {
          (pIVar5->DC).CursorPos.x =
               (pIVar6->Style).ItemSpacing.x + (pIVar5->DC).CursorPosPrevLine.x;
          (pIVar5->DC).CursorPos.y = (pIVar5->DC).CursorPosPrevLine.y;
          (pIVar5->DC).CurrLineSize = (pIVar5->DC).PrevLineSize;
          (pIVar5->DC).CurrLineTextBaseOffset = (pIVar5->DC).PrevLineTextBaseOffset;
        }
        uVar3 = *(uint *)((long)&pIVar4->ID + lVar13);
        uVar10 = 0x20;
        if (uVar3 == tab_bar->SelectedTabId) {
          uVar10 = 0x2a;
        }
        iVar2 = *(int *)((long)&pIVar4->NameOffset + lVar13);
        pcVar9 = "";
        if ((long)iVar2 != -1) {
          if ((tab_bar->TabsNames).Buf.Size <= iVar2) {
            __assert_fail("tab->NameOffset != -1 && tab->NameOffset < TabsNames.Buf.Size",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui_internal.h"
                          ,0x7e5,"const char *ImGuiTabBar::GetTabName(const ImGuiTabItem *) const");
          }
          pcVar9 = (tab_bar->TabsNames).Buf.Data + iVar2;
        }
        Text("%02d%c Tab 0x%08X \'%s\' Offset: %.1f, Width: %.1f/%.1f",
             (double)*(float *)((long)&pIVar4->Offset + lVar13),
             (double)*(float *)((long)&pIVar4->Width + lVar13),
             (double)*(float *)((long)&pIVar4->ContentWidth + lVar13),uVar12 & 0xffffffff,uVar10,
             (ulong)uVar3,pcVar9);
        PopID();
        uVar12 = uVar12 + 1;
        lVar13 = lVar13 + 0x28;
      } while ((long)uVar12 < (long)(tab_bar->Tabs).Size);
    }
    TreePop();
  }
  return;
}

Assistant:

void ImGui::DebugNodeTabBar(ImGuiTabBar* tab_bar, const char* label)
{
    // Standalone tab bars (not associated to docking/windows functionality) currently hold no discernible strings.
    char buf[256];
    char* p = buf;
    const char* buf_end = buf + IM_ARRAYSIZE(buf);
    const bool is_active = (tab_bar->PrevFrameVisible >= GetFrameCount() - 2);
    p += ImFormatString(p, buf_end - p, "%s 0x%08X (%d tabs)%s", label, tab_bar->ID, tab_bar->Tabs.Size, is_active ? "" : " *Inactive*");
    IM_UNUSED(p);
    if (!is_active) { PushStyleColor(ImGuiCol_Text, GetStyleColorVec4(ImGuiCol_TextDisabled)); }
    bool open = TreeNode(label, "%s", buf);
    if (!is_active) { PopStyleColor(); }
    if (is_active && IsItemHovered())
    {
        ImDrawList* draw_list = GetForegroundDrawList();
        draw_list->AddRect(tab_bar->BarRect.Min, tab_bar->BarRect.Max, IM_COL32(255, 255, 0, 255));
        draw_list->AddLine(ImVec2(tab_bar->ScrollingRectMinX, tab_bar->BarRect.Min.y), ImVec2(tab_bar->ScrollingRectMinX, tab_bar->BarRect.Max.y), IM_COL32(0, 255, 0, 255));
        draw_list->AddLine(ImVec2(tab_bar->ScrollingRectMaxX, tab_bar->BarRect.Min.y), ImVec2(tab_bar->ScrollingRectMaxX, tab_bar->BarRect.Max.y), IM_COL32(0, 255, 0, 255));
    }
    if (open)
    {
        for (int tab_n = 0; tab_n < tab_bar->Tabs.Size; tab_n++)
        {
            const ImGuiTabItem* tab = &tab_bar->Tabs[tab_n];
            PushID(tab);
            if (SmallButton("<")) { TabBarQueueReorder(tab_bar, tab, -1); } SameLine(0, 2);
            if (SmallButton(">")) { TabBarQueueReorder(tab_bar, tab, +1); } SameLine();
            Text("%02d%c Tab 0x%08X '%s' Offset: %.1f, Width: %.1f/%.1f",
                tab_n, (tab->ID == tab_bar->SelectedTabId) ? '*' : ' ', tab->ID, (tab->NameOffset != -1) ? tab_bar->GetTabName(tab) : "", tab->Offset, tab->Width, tab->ContentWidth);
            PopID();
        }
        TreePop();
    }
}